

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void * rw::matfxClose(void *o,int32 param_2,int32 param_3)

{
  uint local_1c;
  uint i;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  for (local_1c = 0; local_1c < 0xd; local_1c = local_1c + 1) {
    if (*(ObjPipeline **)(&DAT_00168b70 + (ulong)local_1c * 8) == DAT_00168bd8) {
      *(undefined8 *)(&DAT_00168b70 + (ulong)local_1c * 8) = 0;
    }
  }
  ObjPipeline::destroy(DAT_00168bd8);
  DAT_00168bd8 = (ObjPipeline *)0x0;
  return o;
}

Assistant:

static void*
matfxClose(void *o, int32, int32)
{
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		if(matFXGlobals.pipelines[i] == matFXGlobals.dummypipe)
			matFXGlobals.pipelines[i] = nil;
	matFXGlobals.dummypipe->destroy();
	matFXGlobals.dummypipe = nil;
	return o;
}